

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

void __thiscall BoardView::~BoardView(BoardView *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *ptr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pIVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar6;
  undefined4 extraout_var_03;
  
  if (this->m_validBoard == true) {
    iVar5 = (*this->m_board->_vptr_Board[2])();
    std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::clear
              ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
               CONCAT44(extraout_var,iVar5));
    iVar5 = (*this->m_board->_vptr_Board[4])();
    std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::clear
              ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
               CONCAT44(extraout_var_00,iVar5));
    iVar5 = (*this->m_board->_vptr_Board[3])();
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::clear
              ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
               CONCAT44(extraout_var_01,iVar5));
    iVar5 = (*this->m_board->_vptr_Board[5])();
    std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::clear
              ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)
               CONCAT44(extraout_var_02,iVar5));
    iVar5 = (*this->m_board->_vptr_Board[6])();
    plVar6 = (long *)CONCAT44(extraout_var_03,iVar5);
    if (plVar6[1] != *plVar6) {
      plVar6[1] = *plVar6;
    }
    if (this->m_file != (BRDFileBase *)0x0) {
      (*this->m_file->_vptr_BRDFileBase[1])();
    }
    if (this->m_board != (Board *)0x0) {
      (*this->m_board->_vptr_Board[1])();
    }
    Annotations::Close(&this->m_annotations);
    this->m_validBoard = false;
  }
  pcVar2 = (this->m_error_msg)._M_dataplus._M_p;
  paVar1 = &(this->m_error_msg).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_lastFileOpenName)._M_dataplus._M_p;
  paVar1 = &(this->m_lastFileOpenName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector(&this->m_nets);
  ptr = (this->m_cachedDrawCommands).Data;
  if (ptr != (char *)0x0) {
    ImGui::MemFree(ptr);
  }
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
            (&this->m_partHighlighted);
  std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::~vector
            (&this->m_pinHighlighted);
  p_Var3 = (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->currentlyHoveredPart).super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->currentlyHoveredPin).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->m_pinHighlightedHovered).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  std::vector<Annotation,_std::allocator<Annotation>_>::~vector(&(this->m_annotations).annotations);
  pcVar2 = (this->m_annotations).filename._M_dataplus._M_p;
  paVar1 = &(this->m_annotations).filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&(this->pdfFile).configFilepath);
  std::filesystem::__cxx11::path::~path(&(this->pdfFile).path);
  PDFBridgeEvince::~PDFBridgeEvince(&this->pdfBridge);
  std::filesystem::__cxx11::path::~path
            (&(this->boardSettings).pdfFilePreferences.pdfFileCopy.configFilepath);
  std::filesystem::__cxx11::path::~path(&(this->boardSettings).pdfFilePreferences.pdfFileCopy.path);
  pcVar2 = (this->boardSettings).backgroundImagePreferences.backgroundImageCopy.error._M_dataplus.
           _M_p;
  paVar1 = &(this->boardSettings).backgroundImagePreferences.backgroundImageCopy.error.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path
            (&(this->boardSettings).backgroundImagePreferences.backgroundImageCopy.configFilepath);
  Image::~Image(&(this->boardSettings).backgroundImagePreferences.backgroundImageCopy.bottomImage);
  Image::~Image(&(this->boardSettings).backgroundImagePreferences.backgroundImageCopy.topImage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->boardSettings).backgroundImagePreferences.erroredFiles);
  pIVar4 = (this->keyboardPreferences).addingBinding.modifiers.
           super__Vector_base<ImGuiKey,_std::allocator<ImGuiKey>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pIVar4 != (pointer)0x0) {
    operator_delete(pIVar4,(long)(this->keyboardPreferences).addingBinding.modifiers.
                                 super__Vector_base<ImGuiKey,_std::allocator<ImGuiKey>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pIVar4);
  }
  pcVar2 = (this->keyboardPreferences).addingName._M_dataplus._M_p;
  paVar1 = &(this->keyboardPreferences).addingName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->programPreferences).configCopy.CAEKeyStr._M_dataplus._M_p;
  paVar1 = &(this->programPreferences).configCopy.CAEKeyStr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->programPreferences).configCopy.FZKeyStr._M_dataplus._M_p;
  paVar1 = &(this->programPreferences).configCopy.FZKeyStr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->programPreferences).configCopy.fontName._M_dataplus._M_p;
  paVar1 = &(this->programPreferences).configCopy.fontName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->config).CAEKeyStr._M_dataplus._M_p;
  paVar1 = &(this->config).CAEKeyStr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->config).FZKeyStr._M_dataplus._M_p;
  paVar1 = &(this->config).FZKeyStr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->config).fontName._M_dataplus._M_p;
  paVar1 = &(this->config).fontName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<KeyBinding,_std::allocator<KeyBinding>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<KeyBinding,_std::allocator<KeyBinding>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->keybindings).keybindings._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImGuiKey>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImGuiKey>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImGuiKey>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImGuiKey>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&this->keybindings);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->scparts).dictionary);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->scnets).dictionary);
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
            (&(this->searcher).m_parts);
  std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector
            (&(this->searcher).m_nets);
  FHistory::~FHistory(&this->fhistory);
  Confparse::~Confparse(&this->obvconfig);
  pcVar2 = (this->backgroundImage).error._M_dataplus._M_p;
  paVar1 = &(this->backgroundImage).error.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&(this->backgroundImage).configFilepath);
  Image::~Image(&(this->backgroundImage).bottomImage);
  Image::~Image(&(this->backgroundImage).topImage);
  return;
}

Assistant:

BoardView::~BoardView() {
	if (m_validBoard) {
		m_board->Nets().clear();
		m_board->Pins().clear();
		m_board->Components().clear();
		m_board->OutlinePoints().clear();
		m_board->OutlineSegments().clear();
		delete m_file;
		delete m_board;
		m_annotations.Close();
		m_validBoard = false;
	}
}